

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

uint __thiscall llvm::SourceMgr::FindBufferContainingLoc(SourceMgr *this,SMLoc Loc)

{
  size_type sVar1;
  char *pcVar2;
  const_reference pvVar3;
  pointer pMVar4;
  char *pcVar5;
  uint local_24;
  uint e;
  uint i;
  SourceMgr *this_local;
  SMLoc Loc_local;
  
  local_24 = 0;
  this_local = (SourceMgr *)Loc.Ptr;
  sVar1 = std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::size
                    (&this->Buffers);
  do {
    if (local_24 == (uint)sVar1) {
      return 0;
    }
    pcVar2 = SMLoc::getPointer((SMLoc *)&this_local);
    pvVar3 = std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::
             operator[](&this->Buffers,(ulong)local_24);
    pMVar4 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->(&pvVar3->Buffer);
    pcVar5 = MemoryBuffer::getBufferStart(pMVar4);
    if (pcVar5 <= pcVar2) {
      pcVar2 = SMLoc::getPointer((SMLoc *)&this_local);
      pvVar3 = std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
               ::operator[](&this->Buffers,(ulong)local_24);
      pMVar4 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
               operator->(&pvVar3->Buffer);
      pcVar5 = MemoryBuffer::getBufferEnd(pMVar4);
      if (pcVar2 <= pcVar5) {
        return local_24 + 1;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

unsigned SourceMgr::FindBufferContainingLoc(SMLoc Loc) const {
  for (unsigned i = 0, e = Buffers.size(); i != e; ++i)
    if (Loc.getPointer() >= Buffers[i].Buffer->getBufferStart() &&
        // Use <= here so that a pointer to the null at the end of the buffer
        // is included as part of the buffer.
        Loc.getPointer() <= Buffers[i].Buffer->getBufferEnd())
      return i + 1;
  return 0;
}